

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.h
# Opt level: O0

string * __thiscall
ICM::TypeBase::FunctionType::to_string_abi_cxx11_(string *__return_storage_ptr__,FunctionType *this)

{
  FuncTableUnit *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FunctionType *local_18;
  FunctionType *this_local;
  
  local_18 = this;
  this_local = (FunctionType *)__return_storage_ptr__;
  this_00 = getData(this);
  __rhs = FuncTableUnit::getName_abi_cxx11_(this_00);
  std::operator+(&local_38,"F(",__rhs);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
				return "F(" + getData().getName() + ")";
			}